

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_allocator.cpp
# Opt level: O2

void __thiscall
duckdb::ColumnDataAllocator::ColumnDataAllocator
          (ColumnDataAllocator *this,ColumnDataAllocator *other)

{
  ColumnDataAllocatorType CVar1;
  InternalException *this_00;
  allocator local_41;
  string local_40;
  
  (this->allocated_data).super_vector<duckdb::AllocatedData,_std::allocator<duckdb::AllocatedData>_>
  .super__Vector_base<duckdb::AllocatedData,_std::allocator<duckdb::AllocatedData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->allocated_data).super_vector<duckdb::AllocatedData,_std::allocator<duckdb::AllocatedData>_>
  .super__Vector_base<duckdb::AllocatedData,_std::allocator<duckdb::AllocatedData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->blocks).super_vector<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>.
  super__Vector_base<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->allocated_data).super_vector<duckdb::AllocatedData,_std::allocator<duckdb::AllocatedData>_>
  .super__Vector_base<duckdb::AllocatedData,_std::allocator<duckdb::AllocatedData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks).super_vector<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>.
  super__Vector_base<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks).super_vector<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>.
  super__Vector_base<duckdb::BlockMetaData,_std::allocator<duckdb::BlockMetaData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->shared = false;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this->allocated_size = 0;
  (this->partition_index).index = 0xffffffffffffffff;
  CVar1 = other->type;
  this->type = CVar1;
  if (CVar1 < (HYBRID|IN_MEMORY_ALLOCATOR)) {
    this->alloc = other->alloc;
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_40,"Unrecognized column data allocator type",&local_41);
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

ColumnDataAllocator::ColumnDataAllocator(ColumnDataAllocator &other) {
	type = other.GetType();
	switch (type) {
	case ColumnDataAllocatorType::BUFFER_MANAGER_ALLOCATOR:
	case ColumnDataAllocatorType::HYBRID:
		alloc.allocator = other.alloc.allocator;
		break;
	case ColumnDataAllocatorType::IN_MEMORY_ALLOCATOR:
		alloc.buffer_manager = other.alloc.buffer_manager;
		break;
	default:
		throw InternalException("Unrecognized column data allocator type");
	}
}